

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  string *psVar2;
  uchar value;
  size_t i;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  string local_60;
  string *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message m;
  
  local_40 = __return_storage_ptr__;
  Message::Message((Message *)&local_38);
  uVar3 = 0;
  do {
    psVar2 = local_40;
    if (str->_M_string_length <= uVar3) {
      StringStreamToString(local_40,local_38.ptr_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_38);
      return psVar2;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar3];
    if (bVar1 == 0x22) {
      if (!is_attribute) {
        std::operator<<((ostream *)(local_38.ptr_ + 0x10),'\"');
        goto LAB_001b297a;
      }
      pcVar4 = "&quot;";
LAB_001b2975:
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),pcVar4);
    }
    else {
      if (bVar1 == 0x26) {
        pcVar4 = "&amp;";
        goto LAB_001b2975;
      }
      if (bVar1 != 0x27) {
        if (bVar1 == 0x3e) {
          pcVar4 = "&gt;";
        }
        else {
          if (bVar1 != 0x3c) {
            uVar5 = (uint)bVar1;
            if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
                std::operator<<((ostream *)(local_38.ptr_ + 0x10),"&#x");
                String::FormatByte_abi_cxx11_(&local_60,(String *)(ulong)uVar5,value);
                std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)&local_60);
                std::operator<<((ostream *)(local_38.ptr_ + 0x10),";");
                std::__cxx11::string::~string((string *)&local_60);
              }
              else {
                std::operator<<((ostream *)(local_38.ptr_ + 0x10),bVar1);
              }
            }
            goto LAB_001b297a;
          }
          pcVar4 = "&lt;";
        }
        goto LAB_001b2975;
      }
      if (is_attribute) {
        pcVar4 = "&apos;";
        goto LAB_001b2975;
      }
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),'\'');
    }
LAB_001b297a:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}